

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::setRestLengthScale(btSoftBody *this,btScalar restLengthScale)

{
  int iVar1;
  btCollisionObject *in_RDI;
  float in_XMM0_Da;
  Link *l;
  int ni;
  int i;
  btCollisionObject *in_stack_ffffffffffffffe0;
  int local_10;
  
  local_10 = 0;
  iVar1 = btAlignedObjectArray<btSoftBody::Link>::size
                    ((btAlignedObjectArray<btSoftBody::Link> *)&in_RDI[2].m_deactivationTime);
  for (; local_10 < iVar1; local_10 = local_10 + 1) {
    in_stack_ffffffffffffffe0 =
         (btCollisionObject *)
         btAlignedObjectArray<btSoftBody::Link>::operator[]
                   ((btAlignedObjectArray<btSoftBody::Link> *)&in_RDI[2].m_deactivationTime,local_10
                   );
    (in_stack_ffffffffffffffe0->m_worldTransform).m_basis.m_el[1].m_floats[2] =
         ((in_stack_ffffffffffffffe0->m_worldTransform).m_basis.m_el[1].m_floats[2] /
         *(float *)&in_RDI[4].m_objectsWithoutCollisionCheck) * in_XMM0_Da;
    (in_stack_ffffffffffffffe0->m_worldTransform).m_basis.m_el[2].m_floats[1] =
         (in_stack_ffffffffffffffe0->m_worldTransform).m_basis.m_el[1].m_floats[2] *
         (in_stack_ffffffffffffffe0->m_worldTransform).m_basis.m_el[1].m_floats[2];
  }
  *(float *)&in_RDI[4].m_objectsWithoutCollisionCheck = in_XMM0_Da;
  iVar1 = btCollisionObject::getActivationState(in_RDI);
  if (iVar1 == 2) {
    btCollisionObject::activate(in_stack_ffffffffffffffe0,SUB81((ulong)in_RDI >> 0x38,0));
  }
  return;
}

Assistant:

void btSoftBody::setRestLengthScale(btScalar restLengthScale)
{
	for(int i=0, ni=m_links.size(); i<ni; ++i)
	{
		Link&		l=m_links[i];
		l.m_rl	=	l.m_rl / m_restLengthScale * restLengthScale;
		l.m_c1	=	l.m_rl*l.m_rl;
	}
	m_restLengthScale = restLengthScale;
	
	if (getActivationState() == ISLAND_SLEEPING)
		activate();
}